

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAPI.c
# Opt level: O0

int Cudd_StdPostReordHook(DdManager *dd,char *str,void *data)

{
  FILE *__stream;
  int iVar1;
  abctime aVar2;
  long local_58;
  double totalTimeSec;
  long finalTime;
  int retval;
  long initialTime;
  void *data_local;
  char *str_local;
  DdManager *dd_local;
  
  aVar2 = Extra_CpuTime();
  __stream = (FILE *)dd->out;
  iVar1 = strcmp(str,"BDD");
  if (iVar1 == 0) {
    local_58 = Cudd_ReadNodeCount(dd);
  }
  else {
    local_58 = Cudd_zddReadNodeCount(dd);
  }
  iVar1 = fprintf(__stream,"%ld nodes in %g sec\n",(double)(aVar2 - (long)data) / 1000.0,local_58);
  if (iVar1 == -1) {
    dd_local._4_4_ = 0;
  }
  else {
    iVar1 = fflush((FILE *)dd->out);
    if (iVar1 == -1) {
      dd_local._4_4_ = 0;
    }
    else {
      dd_local._4_4_ = 1;
    }
  }
  return dd_local._4_4_;
}

Assistant:

int
Cudd_StdPostReordHook(
  DdManager *dd,
  const char *str,
  void *data)
{
    long initialTime = (long) data;
    int retval;
    long finalTime = util_cpu_time();
    double totalTimeSec = (double)(finalTime - initialTime) / 1000.0;

    retval = fprintf(dd->out,"%ld nodes in %g sec\n", strcmp(str, "BDD") == 0 ?
                     Cudd_ReadNodeCount(dd) : Cudd_zddReadNodeCount(dd),
                     totalTimeSec);
    if (retval == EOF) return(0);
    retval = fflush(dd->out);
    if (retval == EOF) return(0);
    return(1);

}